

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.h
# Opt level: O0

bool __thiscall VBW::ConvexCell::cell_has_conflict(ConvexCell *this,vec4 *P)

{
  bool bVar1;
  TriangleWithFlags T_00;
  TriangleWithFlags T;
  ushort t;
  vec4 *P_local;
  ConvexCell *this_local;
  
  T.super_Triangle.i = first_triangle(this);
  while( true ) {
    if (T.super_Triangle.i == 0x3fff) {
      return false;
    }
    T_00 = get_triangle_and_flags(this,(uint)T.super_Triangle.i);
    bVar1 = triangle_is_in_conflict(this,T_00,P);
    if (bVar1) break;
    T.super_Triangle.i = next_triangle(this,T.super_Triangle.i);
  }
  return true;
}

Assistant:

bool cell_has_conflict(const vec4& P) {
	for(
	    ushort t = first_triangle();
	    t!=END_OF_LIST; t=next_triangle(t)
	) {
	    TriangleWithFlags T = get_triangle_and_flags(t);
	    if(triangle_is_in_conflict(T,P)) {
		return true;
	    }
	}
	return false;
    }